

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void push_heap_suite::push_increasing_custom(void)

{
  uint uVar1;
  bool bVar2;
  int __tmp;
  ulong uVar3;
  int __tmp_2;
  ulong uVar4;
  uint auStack_50 [6];
  array<int,_5UL> expect;
  int local_24;
  
  auStack_50[2] = 0;
  auStack_50[3] = 0;
  auStack_50[4] = 0;
  auStack_50[5] = 0;
  auStack_50[1] = 0xb;
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x79,"void push_heap_suite::push_increasing_custom()",(int *)(auStack_50 + 1),
             expect._M_elems,expect._M_elems,&local_24);
  uVar1 = auStack_50[1];
  auStack_50[2] = 0x16;
  if ((int)(auStack_50[1] ^ 0x55555555) < 0x55555543) {
    auStack_50[1] = 0x16;
    auStack_50[2] = uVar1;
  }
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x80,"void push_heap_suite::push_increasing_custom()",(int *)(auStack_50 + 1),
             expect._M_elems,expect._M_elems,&local_24);
  uVar1 = auStack_50[1];
  auStack_50[3] = 0x21;
  if ((int)(auStack_50[1] ^ 0x55555555) < 0x55555574) {
    auStack_50[1] = 0x21;
    auStack_50[3] = uVar1;
  }
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x87,"void push_heap_suite::push_increasing_custom()",(int *)(auStack_50 + 1),
             expect._M_elems,expect._M_elems,&local_24);
  auStack_50[4] = 0x2c;
  uVar3 = 4;
  uVar4 = 2;
  do {
    uVar1 = auStack_50[uVar4];
    if ((int)(auStack_50[uVar3] ^ 0x55555555) <= (int)(uVar1 ^ 0x55555555)) break;
    auStack_50[uVar4] = auStack_50[uVar3];
    auStack_50[uVar3] = uVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x8e,"void push_heap_suite::push_increasing_custom()",(int *)(auStack_50 + 1),
             expect._M_elems,expect._M_elems,&local_24);
  auStack_50[5] = 0x37;
  uVar3 = 5;
  uVar4 = 2;
  do {
    uVar1 = auStack_50[uVar4];
    if ((int)(auStack_50[uVar3] ^ 0x55555555) <= (int)(uVar1 ^ 0x55555555)) break;
    auStack_50[uVar4] = auStack_50[uVar3];
    auStack_50[uVar3] = uVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0x37;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x95,"void push_heap_suite::push_increasing_custom()",(int *)(auStack_50 + 1),
             expect._M_elems,expect._M_elems,&local_24);
  return;
}

Assistant:

void push_increasing_custom()
{
    xless<int, 0x55555555> custom;

    std::array<int, 5> heap = {};
    auto last = heap.begin();
    *last++ = 11;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 11, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 11, 22, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 33, 22, 11, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 33, 11, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 55;
    vista::push_heap(heap.begin(), last, custom);
    {
        std::array<int, 5> expect = { 44, 33, 11, 22, 55 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}